

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

bool __thiscall
Jinx::Impl::Parser::CheckProperty(Parser *this,SymbolListCItr currSym,size_t *symCount)

{
  bool bVar1;
  bool bVar2;
  pointer pbVar3;
  SymbolListCItr currSym_00;
  LibraryIPtr library;
  String libraryName;
  undefined1 local_b0 [32];
  pointer local_90;
  LibraryIPtr *local_88;
  __shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> local_60;
  String local_50;
  
  if (((this->m_error == false) &&
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish != currSym._M_current)) &&
     ((currSym._M_current)->type == NameValue)) {
    CheckLibraryName_abi_cxx11_(&local_50,this);
    if (local_50._M_string_length == 0) {
      if ((this->m_library).super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        __assert_fail("m_library",
                      "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                      ,0x34c,
                      "bool Jinx::Impl::Parser::CheckProperty(SymbolListCItr, size_t *) const");
      }
      local_88 = &this->m_library;
      std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,
                 &local_88->super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>);
      local_b0._24_8_ = symCount;
      bVar2 = CheckPropertyName(this,(LibraryIPtr *)&local_70,currSym,symCount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      bVar1 = true;
      if (!bVar2) {
        local_90 = (this->m_importList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_b0._16_8_ = currSym._M_current;
        for (pbVar3 = (this->m_importList).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                      ._M_impl.super__Vector_impl_data._M_start; bVar1 = pbVar3 != local_90, bVar1;
            pbVar3 = pbVar3 + 1) {
          Runtime::GetLibraryInternal
                    ((Runtime *)local_b0,
                     (String *)
                     (this->m_runtime).
                     super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if ((element_type *)local_b0._0_8_ ==
              (local_88->super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
          }
          else {
            std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_80,
                       (__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> *)local_b0);
            bVar2 = CheckPropertyName(this,(LibraryIPtr *)&local_80,(SymbolListCItr)local_b0._16_8_,
                                      (size_t *)local_b0._24_8_);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
            if (bVar2) break;
          }
        }
      }
    }
    else {
      currSym_00._M_current = currSym._M_current + 1;
      if ((currSym_00._M_current ==
           (this->m_symbolList->
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
           super__Vector_impl_data._M_finish) || ((currSym_00._M_current)->type != NameValue)) {
        bVar1 = false;
      }
      else {
        Runtime::GetLibraryInternal
                  ((Runtime *)local_b0,
                   (String *)
                   (this->m_runtime).
                   super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if ((element_type *)local_b0._0_8_ == (element_type *)0x0) {
          __assert_fail("library",
                        "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                        ,0x347,
                        "bool Jinx::Impl::Parser::CheckProperty(SymbolListCItr, size_t *) const");
        }
        std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   (__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> *)local_b0);
        bVar1 = CheckPropertyName(this,(LibraryIPtr *)&local_60,currSym_00,symCount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_50);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline_t bool Parser::CheckProperty(SymbolListCItr currSym, size_t * symCount) const
	{
		// Check symbol validity
		if (m_error || currSym == m_symbolList.end())
			return false;
		if (currSym->type != SymbolType::NameValue)
			return false;

		// Check to see if this begins with a library name
		String libraryName = CheckLibraryName();
		if (!libraryName.empty())
		{
			// Get next symbol and check validity
			auto currentSymbol = currSym;
			++currentSymbol;
			if (currentSymbol == m_symbolList.end())
				return false;
			if (currentSymbol->type != SymbolType::NameValue)
				return false;

			// Check for property name in this specific library
			auto library = m_runtime->GetLibraryInternal(libraryName);
			assert(library);
			return CheckPropertyName(library, currentSymbol, symCount);
		}

		// Check for property name in the current library
		assert(m_library);
		if (CheckPropertyName(m_library, currSym, symCount))
			return true;

		// Check against all imported libraries
		for (auto & importName : m_importList)
		{
			auto library = m_runtime->GetLibraryInternal(importName);
			if (library != m_library && CheckPropertyName(library, currSym, symCount))
				return true;
		}
		return false;
	}